

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O2

void __thiscall qpdf::pl::String::~String(String *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x38);
  return;
}

Assistant:

~String() final = default;